

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.h
# Opt level: O3

void __thiscall Liby::Poller::~Poller(Poller *this)

{
  ~Poller(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Poller() {}